

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_ffi_typeof(jit_State *J,RecordFFData *rd)

{
  CTypeID k;
  TRef TVar1;
  TRef TVar2;
  
  if ((*J->base & 0x1f000000) == 0xa000000) {
    k = argv2ctype(J,*J->base,rd->argv);
    TVar1 = lj_ir_kint(J,k);
    TVar2 = lj_ir_kint(J,0x15);
    (J->fold).ins.field_0.ot = 0x528a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_opt_fold(J);
    *J->base = TVar1;
    return;
  }
  (J->errinfo).field_2.field_0 =
       *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)&J->fn;
  (J->errinfo).field_2.it = 0xfffffff7;
  lj_trace_err_info(J,LJ_TRERR_NYIFFU);
}

Assistant:

void LJ_FASTCALL recff_ffi_typeof(jit_State *J, RecordFFData *rd)
{
  if (tref_iscdata(J->base[0])) {
    TRef trid = lj_ir_kint(J, argv2ctype(J, J->base[0], &rd->argv[0]));
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA),
			lj_ir_kint(J, CTID_CTYPEID), trid);
  } else {
    setfuncV(J->L, &J->errinfo, J->fn);
    lj_trace_err_info(J, LJ_TRERR_NYIFFU);
  }
}